

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senary_executor.hpp
# Opt level: O3

void duckdb::SenaryExecutor::
     Execute<long,long,long,long,long,double,duckdb::timestamp_t,duckdb::timestamp_t(*)(long,long,long,long,long,double)>
               (DataChunk *input,Vector *result,
               _func_timestamp_t_long_long_long_long_long_double *fun)

{
  pointer pVVar1;
  idx_t count;
  ulong *puVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  int64_t *piVar8;
  sel_t *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  unsigned_long *puVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar16;
  element_type *peVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  Vector *v;
  pointer pVVar19;
  reference pvVar20;
  timestamp_t tVar21;
  reference pvVar22;
  reference pvVar23;
  TemplatedValidityData<unsigned_long> *pTVar24;
  _Head_base<0UL,_unsigned_long_*,_false> _Var25;
  size_t c_1;
  size_type sVar26;
  vector<duckdb::Vector,_true> *__range2;
  size_t c;
  size_type __n;
  idx_t iVar27;
  ulong uVar28;
  idx_t iVar29;
  ulong uVar30;
  bool bVar31;
  vector<duckdb::UnifiedVectorFormat,_true> vdata;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_c0;
  data_ptr_t local_a8;
  data_ptr_t local_a0;
  data_ptr_t local_98;
  data_ptr_t local_90;
  data_ptr_t local_88;
  data_ptr_t local_80;
  data_ptr_t local_78;
  vector<unsigned_long,_true> local_70;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  pVVar19 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar1 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar19 == pVVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  else {
    count = input->count;
    bVar31 = false;
    do {
      if (pVVar19->vector_type != CONSTANT_VECTOR) {
        __n = 0;
        Vector::SetVectorType(result,FLAT_VECTOR);
        local_78 = result->data;
        FlatVector::VerifyFlatVector(result);
        ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
        vector(&local_c0,6,(allocator_type *)&local_70);
        bVar31 = true;
        do {
          pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
          pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                              ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,__n);
          Vector::ToUnifiedFormat(pvVar20,count,pvVar22);
          if (bVar31) {
            pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,__n);
            bVar31 = (pvVar22->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0;
          }
          else {
            bVar31 = false;
          }
          __n = __n + 1;
        } while (__n != 6);
        pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,0);
        local_80 = pvVar22->data;
        pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,1);
        local_88 = pvVar22->data;
        pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,2);
        local_90 = pvVar22->data;
        pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,3);
        local_98 = pvVar22->data;
        pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,4);
        local_a0 = pvVar22->data;
        pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,5);
        local_a8 = pvVar22->data;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + 6;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[4] = 0;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[5] = 0;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[2] = 0;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[3] = 0;
        *local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = 0;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[1] = 0;
        local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (bVar31) {
          if (count != 0) {
            iVar27 = 0;
            do {
              sVar26 = 0;
              do {
                pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                    ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,sVar26);
                psVar9 = pvVar22->sel->sel_vector;
                iVar29 = iVar27;
                if (psVar9 != (sel_t *)0x0) {
                  iVar29 = (idx_t)psVar9[iVar27];
                }
                pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,sVar26);
                *pvVar23 = iVar29;
                sVar26 = sVar26 + 1;
              } while (sVar26 != 6);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,0);
              lVar10 = *(long *)(local_80 + *pvVar23 * 8);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,1);
              lVar11 = *(long *)(local_88 + *pvVar23 * 8);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,2);
              lVar12 = *(long *)(local_90 + *pvVar23 * 8);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,3);
              lVar13 = *(long *)(local_98 + *pvVar23 * 8);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,4);
              lVar14 = *(long *)(local_a0 + *pvVar23 * 8);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,5);
              tVar21 = (*fun)(lVar10,lVar11,lVar12,lVar13,lVar14,
                              *(double *)(local_a8 + *pvVar23 * 8));
              *(int64_t *)(local_78 + iVar27 * 8) = tVar21.value;
              iVar27 = iVar27 + 1;
            } while (iVar27 != count);
          }
        }
        else if (count != 0) {
          local_40 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
          uVar28 = 0;
          do {
            sVar26 = 0;
            do {
              pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                  ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,sVar26);
              psVar9 = pvVar22->sel->sel_vector;
              uVar30 = uVar28;
              if (psVar9 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar9[uVar28];
              }
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,sVar26);
              *pvVar23 = uVar30;
              pvVar22 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                  ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,sVar26);
              pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,sVar26);
              puVar15 = (pvVar22->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
              ;
              if ((puVar15 != (unsigned_long *)0x0) &&
                 ((puVar15[*pvVar23 >> 6] >> (*pvVar23 & 0x3f) & 1) == 0)) {
                _Var25._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var25._M_head_impl == (unsigned_long *)0x0) {
                  local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_58,&local_38);
                  p_Var18 = p_Stack_50;
                  peVar17 = local_58;
                  local_58 = (element_type *)0x0;
                  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar17;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var18;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
                  }
                  pTVar24 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(local_40);
                  _Var25._M_head_impl =
                       (pTVar24->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var25._M_head_impl;
                }
                bVar16 = (byte)uVar28 & 0x3f;
                _Var25._M_head_impl[uVar28 >> 6] =
                     _Var25._M_head_impl[uVar28 >> 6] &
                     (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
                goto LAB_01b860bf;
              }
              sVar26 = sVar26 + 1;
            } while (sVar26 != 6);
            pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,0);
            lVar10 = *(long *)(local_80 + *pvVar23 * 8);
            pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,1);
            lVar11 = *(long *)(local_88 + *pvVar23 * 8);
            pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,2);
            lVar12 = *(long *)(local_90 + *pvVar23 * 8);
            pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,3);
            lVar13 = *(long *)(local_98 + *pvVar23 * 8);
            pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,4);
            lVar14 = *(long *)(local_a0 + *pvVar23 * 8);
            pvVar23 = vector<unsigned_long,_true>::operator[](&local_70,5);
            tVar21 = (*fun)(lVar10,lVar11,lVar12,lVar13,lVar14,*(double *)(local_a8 + *pvVar23 * 8))
            ;
            *(int64_t *)(local_78 + uVar28 * 8) = tVar21.value;
LAB_01b860bf:
            uVar28 = uVar28 + 1;
          } while (uVar28 != count);
        }
        if (local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
        ~vector(&local_c0);
        return;
      }
      puVar2 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 != (ulong *)0x0) {
        bVar31 = (bool)(bVar31 | (*puVar2 & 1) == 0);
      }
      pVVar19 = pVVar19 + 1;
    } while (pVVar19 != pVVar1);
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    if (bVar31) {
      ConstantVector::SetNull(result,true);
      return;
    }
  }
  pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  plVar3 = (long *)pvVar20->data;
  pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  plVar4 = (long *)pvVar20->data;
  pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,2);
  plVar5 = (long *)pvVar20->data;
  pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,3);
  plVar6 = (long *)pvVar20->data;
  pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,4);
  plVar7 = (long *)pvVar20->data;
  pvVar20 = vector<duckdb::Vector,_true>::operator[](&input->data,5);
  piVar8 = (int64_t *)result->data;
  tVar21 = (*fun)(*plVar3,*plVar4,*plVar5,*plVar6,*plVar7,*(double *)pvVar20->data);
  *piVar8 = tVar21.value;
  return;
}

Assistant:

static void Execute(DataChunk &input, Vector &result, FUN fun) {
		D_ASSERT(input.ColumnCount() >= NCOLS);
		const auto count = input.size();

		bool all_constant = true;
		bool any_null = false;
		for (const auto &v : input.data) {
			if (v.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				if (ConstantVector::IsNull(v)) {
					any_null = true;
				}
			} else {
				all_constant = false;
				break;
			}
		}

		if (all_constant) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (any_null) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<TA>(input.data[0]);
				auto bdata = ConstantVector::GetData<TB>(input.data[1]);
				auto cdata = ConstantVector::GetData<TC>(input.data[2]);
				auto ddata = ConstantVector::GetData<TD>(input.data[3]);
				auto edata = ConstantVector::GetData<TE>(input.data[4]);
				auto fdata = ConstantVector::GetData<TF>(input.data[5]);
				auto result_data = ConstantVector::GetData<TR>(result);
				result_data[0] = fun(*adata, *bdata, *cdata, *ddata, *edata, *fdata);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<TR>(result);
			auto &result_validity = FlatVector::Validity(result);

			bool all_valid = true;
			vector<UnifiedVectorFormat> vdata(NCOLS);
			for (size_t c = 0; c < NCOLS; ++c) {
				input.data[c].ToUnifiedFormat(count, vdata[c]);
				all_valid = all_valid && vdata[c].validity.AllValid();
			}

			auto adata = (const TA *)(vdata[0].data);
			auto bdata = (const TB *)(vdata[1].data);
			auto cdata = (const TC *)(vdata[2].data);
			auto ddata = (const TD *)(vdata[3].data);
			auto edata = (const TE *)(vdata[4].data);
			auto fdata = (const TF *)(vdata[5].data);

			vector<idx_t> idx(NCOLS);
			if (all_valid) {
				for (idx_t r = 0; r < count; ++r) {
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
					}
					result_data[r] =
					    fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]], fdata[idx[5]]);
				}
			} else {
				for (idx_t r = 0; r < count; ++r) {
					all_valid = true;
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
						if (!vdata[c].validity.RowIsValid(idx[c])) {
							result_validity.SetInvalid(r);
							all_valid = false;
							break;
						}
					}
					if (all_valid) {
						result_data[r] = fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]],
						                     fdata[idx[5]]);
					}
				}
			}
		}
	}